

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O0

int map_set(pMap map,size_t key,void *value)

{
  size_t sVar1;
  size_t sVar2;
  size_t *psVar3;
  void *pvVar4;
  void *values;
  size_t *keys;
  size_t count;
  size_t index;
  int i;
  void *value_local;
  size_t key_local;
  pMap map_local;
  
  index._4_4_ = 0;
  while( true ) {
    if (map->count <= (ulong)(long)index._4_4_) {
      sVar1 = map->count;
      sVar2 = sVar1 + 1;
      psVar3 = (size_t *)realloc(map->keys,sVar2 * 8);
      if (psVar3 == (size_t *)0x0) {
        perror("map_set: realloc failed");
        map_local._4_4_ = -1;
      }
      else {
        pvVar4 = realloc(map->values,sVar2 * map->value_size);
        if (pvVar4 == (void *)0x0) {
          perror("map_set: realloc failed");
          map_local._4_4_ = -1;
        }
        else {
          psVar3[sVar1] = key;
          memcpy((void *)((long)pvVar4 + sVar1 * map->value_size),value,map->value_size);
          map->count = sVar2;
          map->keys = psVar3;
          map->values = pvVar4;
          map_local._4_4_ = 0;
        }
      }
      return map_local._4_4_;
    }
    if (map->keys[index._4_4_] == key) break;
    index._4_4_ = index._4_4_ + 1;
  }
  memcpy((void *)((long)map->values + (long)index._4_4_ * map->value_size),value,map->value_size);
  return 1;
}

Assistant:

int map_set(pMap map, size_t key, void *value)
{
    for (int i = 0; i < map->count; i++)
    {
        if (map->keys[i] == key)
        {
            memcpy(map->values + i * map->value_size, value, map->value_size);
            return MAP_EXISTS;
        }
    }
    size_t index = map->count;
    size_t count = index + 1;
    size_t *keys = realloc(map->keys, count * sizeof(size_t));
    if (keys == NULL)
    {
        perror("map_set: realloc failed");
        return MAP_FAILED;
    }

    void *values = realloc(map->values, count * map->value_size);
    if (values == NULL)
    {
        perror("map_set: realloc failed");
        return MAP_FAILED;
    }
    keys[index] = key;
    memcpy(values + index * map->value_size, value, map->value_size);

    map->count = count;
    map->keys = keys;
    map->values = values;
    return MAP_SUCCESS;
}